

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O0

void create_response_map(fasthessian *fh)

{
  int filter_size;
  response_layer *prVar1;
  long *in_RDI;
  int h;
  int w;
  int init_step;
  int img_height;
  int img_width;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  filter_size = *(int *)(*in_RDI + 4) / *(int *)((long)in_RDI + 0x54);
  prVar1 = initialise_response_layer
                     (filter_size,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
  in_RDI[1] = (long)prVar1;
  prVar1 = initialise_response_layer
                     (filter_size,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
  in_RDI[2] = (long)prVar1;
  prVar1 = initialise_response_layer
                     (filter_size,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
  in_RDI[3] = (long)prVar1;
  prVar1 = initialise_response_layer
                     (filter_size,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
  in_RDI[4] = (long)prVar1;
  prVar1 = initialise_response_layer
                     (filter_size,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
  in_RDI[5] = (long)prVar1;
  prVar1 = initialise_response_layer
                     (filter_size,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
  in_RDI[6] = (long)prVar1;
  prVar1 = initialise_response_layer
                     (filter_size,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
  in_RDI[7] = (long)prVar1;
  prVar1 = initialise_response_layer
                     (filter_size,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
  in_RDI[8] = (long)prVar1;
  return;
}

Assistant:

void create_response_map(struct fasthessian* fh) {
    int img_width = (fh->iimage)->width;
    int img_height = (fh->iimage)->height;
    int init_step = fh->step;

    int w = img_width / init_step;
    int h = img_height / init_step;

    // Octave 1 - 9, 15, 21, 27
    fh->response_map[0] = initialise_response_layer(9, w, h, init_step);
    fh->response_map[1] = initialise_response_layer(15, w, h, init_step);
    fh->response_map[2] = initialise_response_layer(21, w, h, init_step);
    fh->response_map[3] = initialise_response_layer(27, w, h, init_step);

    // Octave 2 - 15, 27, 39, 51
    fh->response_map[4] = initialise_response_layer(39, w/2, h/2, init_step*2);
    fh->response_map[5] = initialise_response_layer(51, w/2, h/2, init_step*2);

    // Octave 3 - 27, 51, 75, 99
    fh->response_map[6] = initialise_response_layer(75, w/4, h/4, init_step*4);
    fh->response_map[7] = initialise_response_layer(99, w/4, h/4, init_step*4);
}